

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

bool argparse::Argument::is_positional(string_view name,string_view prefix_chars)

{
  string_view s;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  string_view s_00;
  undefined1 auStack_30 [4];
  int first;
  string_view prefix_chars_local;
  string_view name_local;
  
  prefix_chars_local._M_len = (size_t)prefix_chars._M_str;
  s_00._M_str = (char *)prefix_chars._M_len;
  s_00._M_len = name._M_str;
  prefix_chars_local._M_str = (char *)name._M_len;
  _auStack_30 = s_00._M_str;
  iVar2 = lookahead((Argument *)prefix_chars_local._M_str,s_00);
  if (iVar2 == -1) {
    name_local._M_str._7_1_ = true;
  }
  else {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30,(char)iVar2,0)
    ;
    if (sVar3 == 0xffffffffffffffff) {
      name_local._M_str._7_1_ = true;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&prefix_chars_local._M_str,1);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &prefix_chars_local._M_str);
      if (bVar1) {
        name_local._M_str._7_1_ = true;
      }
      else {
        s._M_str = s_00._M_len;
        s._M_len = (size_t)prefix_chars_local._M_str;
        name_local._M_str._7_1_ = is_decimal_literal(s);
      }
    }
  }
  return name_local._M_str._7_1_;
}

Assistant:

static bool is_positional(std::string_view name,
                            std::string_view prefix_chars) {
    auto first = lookahead(name);

    if (first == eof) {
      return true;
    } else if (prefix_chars.find(static_cast<char>(first)) !=
               std::string_view::npos) {
      name.remove_prefix(1);
      if (name.empty()) {
        return true;
      }
      return is_decimal_literal(name);
    }
    return true;
  }